

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

string * phosg::str_replace_all
                   (string *__return_storage_ptr__,string *s,char *target,char *replacement)

{
  size_t __n;
  size_t __n_00;
  size_type sVar1;
  size_type __pos;
  char *__s;
  
  __n = strlen(target);
  __n_00 = strlen(replacement);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (s->_M_string_length != 0) {
    __pos = 0;
    do {
      sVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find(s,target,__pos,__n);
      __s = (s->_M_dataplus)._M_p + __pos;
      if (sVar1 == 0xffffffffffffffff) {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,__s,s->_M_string_length - __pos);
        __pos = s->_M_string_length;
      }
      else {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,__s,sVar1 - __pos);
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,replacement,__n_00);
        __pos = sVar1 + __n;
      }
    } while (__pos < s->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

string str_replace_all(const string& s, const char* target, const char* replacement) {
  size_t target_size = strlen(target);
  size_t replacement_size = strlen(replacement);

  string ret;
  for (size_t read_offset = 0; read_offset < s.size();) {
    size_t find_offset = s.find(target, read_offset, target_size);
    if (find_offset == string::npos) {
      ret.append(s.data() + read_offset, s.size() - read_offset);
      read_offset = s.size();
    } else {
      ret.append(s.data() + read_offset, find_offset - read_offset);
      ret.append(replacement, replacement_size);
      read_offset = find_offset + target_size;
    }
  }
  return ret;
}